

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_lookupSlot(sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t slotName)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t found;
  sysbvm_tuple_t local_20;
  
  if (((type & 0xf) != 0 || type == 0) || (_Var1 = sysbvm_tuple_isDummyValue(type), _Var1)) {
    sVar2 = 0;
  }
  else {
    if (*(sysbvm_tuple_t *)(type + 0x80) != 0) {
      local_20 = 0;
      _Var1 = sysbvm_methodDictionary_find(*(sysbvm_tuple_t *)(type + 0x80),slotName,&local_20);
      if (_Var1) {
        return local_20;
      }
    }
    sVar2 = sysbvm_type_getSupertype(type);
    sVar2 = sysbvm_type_lookupSlot(context,sVar2,slotName);
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_lookupSlot(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t slotName)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;

    sysbvm_tuple_t slotDictionary = sysbvm_type_getSlotDictionary(type);
    if(slotDictionary)
    {
        sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
        if(sysbvm_methodDictionary_find(slotDictionary, slotName, &found))
            return found;
    }

    return sysbvm_type_lookupSlot(context, sysbvm_type_getSupertype(type), slotName);
}